

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Chess.cpp
# Opt level: O1

void __thiscall
PieceSquareTableInterpolating::PieceSquareTableInterpolating
          (PieceSquareTableInterpolating *this,PieceSquareRawTableType *table,
          float fInterpolationFactor)

{
  memset(&(this->super_PieceSquareTableBase).m_SourceTable,0,0x100);
  (this->super_PieceSquareTableBase)._vptr_PieceSquareTableBase =
       (_func_int **)&PTR_InvertColor_00120640;
  (this->m_InterpolatedTables).
  super__Vector_base<PieceSquareTableBase,_std::allocator<PieceSquareTableBase>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (this->m_InterpolatedTables).
  super__Vector_base<PieceSquareTableBase,_std::allocator<PieceSquareTableBase>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->m_InterpolatedTables).
  super__Vector_base<PieceSquareTableBase,_std::allocator<PieceSquareTableBase>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->m_SourceTables).
  super__Vector_base<PieceSquareTableBase,_std::allocator<PieceSquareTableBase>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (this->m_SourceTables).
  super__Vector_base<PieceSquareTableBase,_std::allocator<PieceSquareTableBase>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->m_SourceTables).
  super__Vector_base<PieceSquareTableBase,_std::allocator<PieceSquareTableBase>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->m_Phases).super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data
  ._M_start = (pointer)0x0;
  (this->m_Phases).super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data
  ._M_finish = (pointer)0x0;
  (this->m_Phases).super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data
  ._M_end_of_storage = (pointer)0x0;
  this->m_nCurrentTable = 0;
  this->m_fPhase = 0.0;
  Append(this,table,fInterpolationFactor);
  return;
}

Assistant:

PieceSquareTableInterpolating( const PieceSquareRawTableType &table,
                                   const float fInterpolationFactor = 0.0f ) :
        m_nCurrentTable( 0 ),
        m_fPhase( 0.0f )
    {
        Append( table, fInterpolationFactor );
    }